

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall
OpenMD::SelectionCompiler::lookingAtInteger(SelectionCompiler *this,bool allowNegative)

{
  int iVar1;
  char *pcVar2;
  byte in_SIL;
  string *in_RDI;
  bool bVar3;
  int ichBeginDigits;
  int ichT;
  allocator<char> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  string local_40 [36];
  int local_1c;
  int local_18;
  byte local_11;
  byte local_1;
  
  local_11 = in_SIL & 1;
  if (*(int *)((long)&in_RDI[6].field_2 + 8) == *(int *)&in_RDI[6].field_2) {
    local_1 = 0;
  }
  else {
    local_18 = *(int *)((long)&in_RDI[6].field_2 + 8);
    if (local_11 != 0) {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)(in_RDI + 1));
      if (*pcVar2 == '-') {
        local_18 = local_18 + 1;
      }
    }
    local_1c = local_18;
    while( true ) {
      bVar3 = false;
      if (local_18 < *(int *)&in_RDI[6].field_2) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)(in_RDI + 1));
        iVar1 = isdigit((int)*pcVar2);
        bVar3 = iVar1 != 0;
      }
      if (!bVar3) break;
      local_18 = local_18 + 1;
    }
    if (local_1c == local_18) {
      local_1 = 0;
    }
    else {
      *(int *)((long)&in_RDI[6].field_2 + 0xc) = local_18 - *(int *)((long)&in_RDI[6].field_2 + 8);
      std::__cxx11::string::substr((ulong)&stack0xffffffffffffffa0,(ulong)(in_RDI + 1));
      std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
      local_1 = isInteger(in_RDI);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SelectionCompiler::lookingAtInteger(bool allowNegative) {
    if (ichToken == cchScript) { return false; }
    int ichT = ichToken;
    if (allowNegative && script[ichToken] == '-') { ++ichT; }
    int ichBeginDigits = ichT;
    while (ichT < cchScript && std::isdigit(script[ichT])) {
      ++ichT;
    }
    if (ichBeginDigits == ichT) { return false; }
    cchToken = ichT - ichToken;
    return isInteger(script.substr(ichToken, cchToken).c_str());
  }